

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O2

IntrinsicResult __thiscall
MiniScript::Intrinsic::Execute
          (Intrinsic *this,long id,Context *context,IntrinsicResult *partialResult)

{
  _func_IntrinsicResult_Context_ptr_IntrinsicResult *p_Var1;
  Intrinsic *pIVar2;
  IntrinsicResult local_30;
  
  pIVar2 = GetByID(id);
  p_Var1 = pIVar2->code;
  IntrinsicResult::IntrinsicResult(&local_30,partialResult);
  (*p_Var1)((Context *)this,(IntrinsicResult)context);
  IntrinsicResult::release(&local_30);
  return (IntrinsicResult)(IntrinsicResultStorage *)this;
}

Assistant:

IntrinsicResult Intrinsic::Execute(long id, Context *context, IntrinsicResult partialResult) {
		Intrinsic* item = GetByID(id);
		return item->code(context, partialResult);
	}